

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessUNIX.c
# Opt level: O0

void cmsysProcess_Execute(cmsysProcess *cp)

{
  int iVar1;
  char *pcVar2;
  int *piVar3;
  bool bVar4;
  int local_6c;
  int iStack_58;
  int res;
  int p_2 [2];
  int nextStdIn;
  kwsysProcessCreateInformation si;
  long local_30;
  int local_28;
  int local_24;
  int p_1 [2];
  int p [2];
  int r;
  int i;
  cmsysProcess *cp_local;
  
  if ((cp != (cmsysProcess *)0x0) && (cp->State != 3)) {
    if (cp->NumberOfCommands < 1) {
      strcpy(cp->ErrorMessage,"No command");
      cp->State = 1;
    }
    else {
      iVar1 = kwsysProcessInitialize(cp);
      if (iVar1 == 0) {
        strcpy(cp->ErrorMessage,"Out of memory");
        cp->State = 1;
      }
      else {
        if (cp->WorkingDirectory != (char *)0x0) {
          pcVar2 = getcwd(cp->RealWorkingDirectory,(long)cp->RealWorkingDirectoryLength);
          if (pcVar2 == (char *)0x0) {
            kwsysProcessCleanup(cp,1);
            return;
          }
          do {
            iVar1 = chdir(cp->WorkingDirectory);
            bVar4 = false;
            if (iVar1 < 0) {
              piVar3 = __errno_location();
              bVar4 = *piVar3 == 4;
            }
          } while (bVar4);
          if (iVar1 < 0) {
            kwsysProcessCleanup(cp,1);
            return;
          }
        }
        if ((cp->OptionDetach == 0) && (iVar1 = kwsysProcessesAdd(cp), iVar1 == 0)) {
          kwsysProcessCleanup(cp,1);
        }
        else {
          if (cp->PipeFileSTDIN == (char *)0x0) {
            if (cp->PipeSharedSTDIN == 0) {
              if (cp->PipeNativeSTDIN[0] < 0) {
                cp->PipeChildStd[0] = -1;
              }
              else {
                cp->PipeChildStd[0] = cp->PipeNativeSTDIN[0];
                iVar1 = fcntl(cp->PipeNativeSTDIN[0],2,1);
                if ((iVar1 < 0) || (iVar1 = fcntl(cp->PipeNativeSTDIN[1],2,1), iVar1 < 0)) {
                  kwsysProcessCleanup(cp,1);
                  return;
                }
              }
            }
            else {
              cp->PipeChildStd[0] = 0;
            }
          }
          else {
            iVar1 = open(cp->PipeFileSTDIN,0);
            cp->PipeChildStd[0] = iVar1;
            if (cp->PipeChildStd[0] < 0) {
              kwsysProcessCleanup(cp,1);
              return;
            }
            iVar1 = fcntl(cp->PipeChildStd[0],2,1);
            if (iVar1 < 0) {
              kwsysProcessCleanup(cp,1);
              return;
            }
          }
          iVar1 = pipe(p_1);
          if (iVar1 < 0) {
            kwsysProcessCleanup(cp,1);
          }
          else {
            cp->PipeReadEnds[0] = p_1[0];
            cp->PipeChildStd[1] = p_1[1];
            iVar1 = fcntl(p_1[0],2,1);
            if ((iVar1 < 0) || (iVar1 = fcntl(p_1[1],2,1), iVar1 < 0)) {
              kwsysProcessCleanup(cp,1);
            }
            else {
              iVar1 = kwsysProcessSetNonBlocking(p_1[0]);
              if (iVar1 == 0) {
                kwsysProcessCleanup(cp,1);
              }
              else {
                if (cp->PipeFileSTDOUT == (char *)0x0) {
                  if (cp->PipeSharedSTDOUT == 0) {
                    if ((-1 < cp->PipeNativeSTDOUT[1]) &&
                       (iVar1 = kwsysProcessSetupOutputPipeNative
                                          (cp->PipeChildStd + 1,cp->PipeNativeSTDOUT), iVar1 == 0))
                    {
                      kwsysProcessCleanup(cp,1);
                      return;
                    }
                  }
                  else {
                    kwsysProcessCleanupDescriptor(cp->PipeChildStd + 1);
                    cp->PipeChildStd[1] = 1;
                  }
                }
                else {
                  iVar1 = kwsysProcessSetupOutputPipeFile(cp->PipeChildStd + 1,cp->PipeFileSTDOUT);
                  if (iVar1 == 0) {
                    kwsysProcessCleanup(cp,1);
                    return;
                  }
                }
                iVar1 = pipe(&local_28);
                if (iVar1 < 0) {
                  kwsysProcessCleanup(cp,1);
                }
                else {
                  cp->PipeReadEnds[1] = local_28;
                  cp->PipeChildStd[2] = local_24;
                  iVar1 = fcntl(local_28,2,1);
                  if ((iVar1 < 0) || (iVar1 = fcntl(local_24,2,1), iVar1 < 0)) {
                    kwsysProcessCleanup(cp,1);
                  }
                  else {
                    iVar1 = kwsysProcessSetNonBlocking(local_28);
                    if (iVar1 == 0) {
                      kwsysProcessCleanup(cp,1);
                    }
                    else {
                      if (cp->PipeFileSTDERR == (char *)0x0) {
                        if (cp->PipeSharedSTDERR == 0) {
                          if ((-1 < cp->PipeNativeSTDERR[1]) &&
                             (iVar1 = kwsysProcessSetupOutputPipeNative
                                                (cp->PipeChildStd + 2,cp->PipeNativeSTDERR),
                             iVar1 == 0)) {
                            kwsysProcessCleanup(cp,1);
                            return;
                          }
                        }
                        else {
                          kwsysProcessCleanupDescriptor(cp->PipeChildStd + 2);
                          cp->PipeChildStd[2] = 2;
                        }
                      }
                      else {
                        iVar1 = kwsysProcessSetupOutputPipeFile
                                          (cp->PipeChildStd + 2,cp->PipeFileSTDERR);
                        if (iVar1 == 0) {
                          kwsysProcessCleanup(cp,1);
                          return;
                        }
                      }
                      join_0x00000010_0x00000000_ = kwsysProcessTimeGetCurrent();
                      (cp->StartTime).tv_sec = (long)si.ErrorPipe;
                      (cp->StartTime).tv_usec = local_30;
                      (cp->TimeoutTime).tv_sec = -1;
                      (cp->TimeoutTime).tv_usec = -1;
                      stack0xffffffffffffffb4 = 0xffffffffffffffff;
                      si.StdIn = -1;
                      si.StdOut = -1;
                      si.StdErr = -1;
                      p_2[0] = cp->PipeChildStd[0];
                      for (p[1] = 0; iVar1 = p_2[0], p[1] < cp->NumberOfCommands; p[1] = p[1] + 1) {
                        stack0xffffffffffffffb4 = CONCAT44(nextStdIn,p_2[0]);
                        if (p[1] == cp->NumberOfCommands + -1) {
                          p_2[0] = -1;
                          stack0xffffffffffffffb4 = CONCAT44(cp->PipeChildStd[1],iVar1);
                        }
                        else {
                          _iStack_58 = 0xffffffffffffffff;
                          iVar1 = pipe(&iStack_58);
                          if (iVar1 < 0) {
                            if (p_2[0] != cp->PipeChildStd[0]) {
                              kwsysProcessCleanupDescriptor(p_2);
                            }
                            kwsysProcessCleanup(cp,1);
                            return;
                          }
                          iVar1 = fcntl(iStack_58,2,1);
                          if (iVar1 < 0) {
LAB_005b02de:
                            close(iStack_58);
                            close(res);
                            if (p_2[0] != cp->PipeChildStd[0]) {
                              kwsysProcessCleanupDescriptor(p_2);
                            }
                            kwsysProcessCleanup(cp,1);
                            return;
                          }
                          iVar1 = fcntl(res,2,1);
                          if (iVar1 < 0) goto LAB_005b02de;
                          p_2[0] = iStack_58;
                          stack0xffffffffffffffb4 = CONCAT44(res,p_2[1]);
                        }
                        if (cp->MergeOutput == 0) {
                          local_6c = cp->PipeChildStd[2];
                        }
                        else {
                          local_6c = cp->PipeChildStd[1];
                        }
                        si.StdIn = local_6c;
                        iVar1 = kwsysProcessCreate(cp,p[1],(kwsysProcessCreateInformation *)
                                                           (p_2 + 1));
                        if (p_2[1] != cp->PipeChildStd[0]) {
                          kwsysProcessCleanupDescriptor(p_2 + 1);
                        }
                        if (nextStdIn != cp->PipeChildStd[1]) {
                          kwsysProcessCleanupDescriptor(&nextStdIn);
                        }
                        if ((si.StdIn != cp->PipeChildStd[2]) && (cp->MergeOutput == 0)) {
                          kwsysProcessCleanupDescriptor(&si.StdIn);
                        }
                        if (iVar1 == 0) {
                          kwsysProcessCleanupDescriptor(&si.StdOut);
                          kwsysProcessCleanupDescriptor(&si.StdErr);
                          if (p_2[0] != cp->PipeChildStd[0]) {
                            kwsysProcessCleanupDescriptor(p_2);
                          }
                          kwsysProcessCleanup(cp,1);
                          return;
                        }
                      }
                      for (p[1] = 0; p[1] < 3; p[1] = p[1] + 1) {
                        kwsysProcessCleanupDescriptor(cp->PipeChildStd + p[1]);
                      }
                      if (cp->RealWorkingDirectory != (char *)0x0) {
                        do {
                          iVar1 = chdir(cp->RealWorkingDirectory);
                          bVar4 = false;
                          if (iVar1 < 0) {
                            piVar3 = __errno_location();
                            bVar4 = *piVar3 == 4;
                          }
                        } while (bVar4);
                        free(cp->RealWorkingDirectory);
                        cp->RealWorkingDirectory = (char *)0x0;
                      }
                      cp->PipesLeft = 3;
                      cp->State = 3;
                      cp->Detached = cp->OptionDetach;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void kwsysProcess_Execute(kwsysProcess* cp)
{
  int i;

  /* Do not execute a second copy simultaneously.  */
  if (!cp || cp->State == kwsysProcess_State_Executing) {
    return;
  }

  /* Make sure we have something to run.  */
  if (cp->NumberOfCommands < 1) {
    strcpy(cp->ErrorMessage, "No command");
    cp->State = kwsysProcess_State_Error;
    return;
  }

  /* Initialize the control structure for a new process.  */
  if (!kwsysProcessInitialize(cp)) {
    strcpy(cp->ErrorMessage, "Out of memory");
    cp->State = kwsysProcess_State_Error;
    return;
  }

#if defined(__VMS)
  /* Make sure pipes behave like streams on VMS.  */
  if (!kwsysProcessSetVMSFeature("DECC$STREAM_PIPE", 1)) {
    kwsysProcessCleanup(cp, 1);
    return;
  }
#endif

  /* Save the real working directory of this process and change to
     the working directory for the child processes.  This is needed
     to make pipe file paths evaluate correctly.  */
  if (cp->WorkingDirectory) {
    int r;
    if (!getcwd(cp->RealWorkingDirectory,
                (size_t)(cp->RealWorkingDirectoryLength))) {
      kwsysProcessCleanup(cp, 1);
      return;
    }

    /* Some platforms specify that the chdir call may be
       interrupted.  Repeat the call until it finishes.  */
    while (((r = chdir(cp->WorkingDirectory)) < 0) && (errno == EINTR))
      ;
    if (r < 0) {
      kwsysProcessCleanup(cp, 1);
      return;
    }
  }

  /* If not running a detached child, add this object to the global
     set of process objects that wish to be notified when a child
     exits.  */
  if (!cp->OptionDetach) {
    if (!kwsysProcessesAdd(cp)) {
      kwsysProcessCleanup(cp, 1);
      return;
    }
  }

  /* Setup the stdin pipe for the first process.  */
  if (cp->PipeFileSTDIN) {
    /* Open a file for the child's stdin to read.  */
    cp->PipeChildStd[0] = open(cp->PipeFileSTDIN, O_RDONLY);
    if (cp->PipeChildStd[0] < 0) {
      kwsysProcessCleanup(cp, 1);
      return;
    }

    /* Set close-on-exec flag on the pipe's end.  */
    if (fcntl(cp->PipeChildStd[0], F_SETFD, FD_CLOEXEC) < 0) {
      kwsysProcessCleanup(cp, 1);
      return;
    }
  } else if (cp->PipeSharedSTDIN) {
    cp->PipeChildStd[0] = 0;
  } else if (cp->PipeNativeSTDIN[0] >= 0) {
    cp->PipeChildStd[0] = cp->PipeNativeSTDIN[0];

    /* Set close-on-exec flag on the pipe's ends.  The read end will
       be dup2-ed into the stdin descriptor after the fork but before
       the exec.  */
    if ((fcntl(cp->PipeNativeSTDIN[0], F_SETFD, FD_CLOEXEC) < 0) ||
        (fcntl(cp->PipeNativeSTDIN[1], F_SETFD, FD_CLOEXEC) < 0)) {
      kwsysProcessCleanup(cp, 1);
      return;
    }
  } else {
    cp->PipeChildStd[0] = -1;
  }

  /* Create the output pipe for the last process.
     We always create this so the pipe can be passed to select even if
     it will report closed immediately.  */
  {
    /* Create the pipe.  */
    int p[2];
    if (pipe(p KWSYSPE_VMS_NONBLOCK) < 0) {
      kwsysProcessCleanup(cp, 1);
      return;
    }

    /* Store the pipe.  */
    cp->PipeReadEnds[KWSYSPE_PIPE_STDOUT] = p[0];
    cp->PipeChildStd[1] = p[1];

    /* Set close-on-exec flag on the pipe's ends.  */
    if ((fcntl(p[0], F_SETFD, FD_CLOEXEC) < 0) ||
        (fcntl(p[1], F_SETFD, FD_CLOEXEC) < 0)) {
      kwsysProcessCleanup(cp, 1);
      return;
    }

    /* Set to non-blocking in case select lies, or for the polling
       implementation.  */
    if (!kwsysProcessSetNonBlocking(p[0])) {
      kwsysProcessCleanup(cp, 1);
      return;
    }
  }

  if (cp->PipeFileSTDOUT) {
    /* Use a file for stdout.  */
    if (!kwsysProcessSetupOutputPipeFile(&cp->PipeChildStd[1],
                                         cp->PipeFileSTDOUT)) {
      kwsysProcessCleanup(cp, 1);
      return;
    }
  } else if (cp->PipeSharedSTDOUT) {
    /* Use the parent stdout.  */
    kwsysProcessCleanupDescriptor(&cp->PipeChildStd[1]);
    cp->PipeChildStd[1] = 1;
  } else if (cp->PipeNativeSTDOUT[1] >= 0) {
    /* Use the given descriptor for stdout.  */
    if (!kwsysProcessSetupOutputPipeNative(&cp->PipeChildStd[1],
                                           cp->PipeNativeSTDOUT)) {
      kwsysProcessCleanup(cp, 1);
      return;
    }
  }

  /* Create stderr pipe to be shared by all processes in the pipeline.
     We always create this so the pipe can be passed to select even if
     it will report closed immediately.  */
  {
    /* Create the pipe.  */
    int p[2];
    if (pipe(p KWSYSPE_VMS_NONBLOCK) < 0) {
      kwsysProcessCleanup(cp, 1);
      return;
    }

    /* Store the pipe.  */
    cp->PipeReadEnds[KWSYSPE_PIPE_STDERR] = p[0];
    cp->PipeChildStd[2] = p[1];

    /* Set close-on-exec flag on the pipe's ends.  */
    if ((fcntl(p[0], F_SETFD, FD_CLOEXEC) < 0) ||
        (fcntl(p[1], F_SETFD, FD_CLOEXEC) < 0)) {
      kwsysProcessCleanup(cp, 1);
      return;
    }

    /* Set to non-blocking in case select lies, or for the polling
       implementation.  */
    if (!kwsysProcessSetNonBlocking(p[0])) {
      kwsysProcessCleanup(cp, 1);
      return;
    }
  }

  if (cp->PipeFileSTDERR) {
    /* Use a file for stderr.  */
    if (!kwsysProcessSetupOutputPipeFile(&cp->PipeChildStd[2],
                                         cp->PipeFileSTDERR)) {
      kwsysProcessCleanup(cp, 1);
      return;
    }
  } else if (cp->PipeSharedSTDERR) {
    /* Use the parent stderr.  */
    kwsysProcessCleanupDescriptor(&cp->PipeChildStd[2]);
    cp->PipeChildStd[2] = 2;
  } else if (cp->PipeNativeSTDERR[1] >= 0) {
    /* Use the given handle for stderr.  */
    if (!kwsysProcessSetupOutputPipeNative(&cp->PipeChildStd[2],
                                           cp->PipeNativeSTDERR)) {
      kwsysProcessCleanup(cp, 1);
      return;
    }
  }

  /* The timeout period starts now.  */
  cp->StartTime = kwsysProcessTimeGetCurrent();
  cp->TimeoutTime.tv_sec = -1;
  cp->TimeoutTime.tv_usec = -1;

  /* Create the pipeline of processes.  */
  {
    kwsysProcessCreateInformation si = { -1, -1, -1, { -1, -1 } };
    int nextStdIn = cp->PipeChildStd[0];
    for (i = 0; i < cp->NumberOfCommands; ++i) {
      /* Setup the process's pipes.  */
      si.StdIn = nextStdIn;
      if (i == cp->NumberOfCommands - 1) {
        nextStdIn = -1;
        si.StdOut = cp->PipeChildStd[1];
      } else {
        /* Create a pipe to sit between the children.  */
        int p[2] = { -1, -1 };
        if (pipe(p KWSYSPE_VMS_NONBLOCK) < 0) {
          if (nextStdIn != cp->PipeChildStd[0]) {
            kwsysProcessCleanupDescriptor(&nextStdIn);
          }
          kwsysProcessCleanup(cp, 1);
          return;
        }

        /* Set close-on-exec flag on the pipe's ends.  */
        if ((fcntl(p[0], F_SETFD, FD_CLOEXEC) < 0) ||
            (fcntl(p[1], F_SETFD, FD_CLOEXEC) < 0)) {
          close(p[0]);
          close(p[1]);
          if (nextStdIn != cp->PipeChildStd[0]) {
            kwsysProcessCleanupDescriptor(&nextStdIn);
          }
          kwsysProcessCleanup(cp, 1);
          return;
        }
        nextStdIn = p[0];
        si.StdOut = p[1];
      }
      si.StdErr = cp->MergeOutput ? cp->PipeChildStd[1] : cp->PipeChildStd[2];

      {
        int res = kwsysProcessCreate(cp, i, &si);

        /* Close our copies of pipes used between children.  */
        if (si.StdIn != cp->PipeChildStd[0]) {
          kwsysProcessCleanupDescriptor(&si.StdIn);
        }
        if (si.StdOut != cp->PipeChildStd[1]) {
          kwsysProcessCleanupDescriptor(&si.StdOut);
        }
        if (si.StdErr != cp->PipeChildStd[2] && !cp->MergeOutput) {
          kwsysProcessCleanupDescriptor(&si.StdErr);
        }

        if (!res) {
          kwsysProcessCleanupDescriptor(&si.ErrorPipe[0]);
          kwsysProcessCleanupDescriptor(&si.ErrorPipe[1]);
          if (nextStdIn != cp->PipeChildStd[0]) {
            kwsysProcessCleanupDescriptor(&nextStdIn);
          }
          kwsysProcessCleanup(cp, 1);
          return;
        }
      }
    }
  }

  /* The parent process does not need the child's pipe ends.  */
  for (i = 0; i < 3; ++i) {
    kwsysProcessCleanupDescriptor(&cp->PipeChildStd[i]);
  }

  /* Restore the working directory. */
  if (cp->RealWorkingDirectory) {
    /* Some platforms specify that the chdir call may be
       interrupted.  Repeat the call until it finishes.  */
    while ((chdir(cp->RealWorkingDirectory) < 0) && (errno == EINTR))
      ;
    free(cp->RealWorkingDirectory);
    cp->RealWorkingDirectory = 0;
  }

  /* All the pipes are now open.  */
  cp->PipesLeft = KWSYSPE_PIPE_COUNT;

  /* The process has now started.  */
  cp->State = kwsysProcess_State_Executing;
  cp->Detached = cp->OptionDetach;
}